

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O3

Pattern * __thiscall
trieste::detail::Pattern::operator~(Pattern *__return_storage_ptr__,Pattern *this)

{
  undefined1 local_a9;
  PatternPtr local_a8;
  Opt *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  FastPattern local_88;
  
  local_98 = (Opt *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<trieste::detail::Opt,std::allocator<trieste::detail::Opt>,std::shared_ptr<trieste::detail::PatternDef>const&>
            (&_Stack_90,&local_98,(allocator<trieste::detail::Opt> *)&local_a9,
             (shared_ptr<trieste::detail::PatternDef> *)this);
  local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_98->super_PatternDef;
  local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi;
  local_98 = (Opt *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  FastPattern::match_opt(&local_88,&this->fast_pattern);
  Pattern(__return_storage_ptr__,&local_a8,&local_88);
  CLI::std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree(&local_88.parents._M_t);
  CLI::std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_88);
  if (local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Pattern operator~() const
      {
        return {
          std::make_shared<Opt>(pattern), FastPattern::match_opt(fast_pattern)};
      }